

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O3

void pnga_matmul_mirrored
               (char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer ailo,
               Integer aihi,Integer ajlo,Integer ajhi,Integer g_b,Integer bilo,Integer bihi,
               Integer bjlo,Integer bjhi,Integer g_c,Integer cilo,Integer cihi,Integer cjlo,
               Integer cjhi)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  Integer IVar4;
  logical lVar5;
  logical lVar6;
  Integer IVar7;
  long lVar8;
  void *__s;
  long lVar9;
  void *buf;
  size_t __n;
  long lVar10;
  char *pcVar11;
  Integer *pIVar12;
  undefined8 *alpha_00;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  long local_1d0;
  Integer avail;
  long local_1c0;
  Integer atype;
  Integer local_1a8;
  Integer local_1a0;
  void *local_198;
  Integer local_190;
  byte *local_188;
  byte *local_180;
  long local_178;
  long local_170;
  Integer dims [2];
  undefined8 local_150;
  void *local_148;
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  Integer kdim;
  long local_108;
  long local_100;
  long local_f8;
  Integer local_f0;
  Integer jdim;
  int local_dc;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  Integer local_98;
  Integer cdim;
  Integer idim;
  Integer rank;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  Integer ctype;
  Integer btype;
  
  local_1a0 = g_a;
  local_190 = ailo;
  local_188 = (byte *)transb;
  local_180 = (byte *)transa;
  local_148 = alpha;
  IVar4 = pnga_nodeid();
  iVar3 = _ga_sync_end;
  local_78 = 0x3ff0000000000000;
  uStack_70 = 0;
  local_150 = 0x3f800000;
  bVar17 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar17) {
    pnga_sync();
  }
  lVar5 = pnga_is_mirrored(local_1a0);
  lVar6 = pnga_is_mirrored(g_b);
  if (lVar5 == lVar6) {
    lVar5 = pnga_is_mirrored(local_1a0);
    lVar6 = pnga_is_mirrored(g_c);
    if (lVar5 != lVar6) goto LAB_00125a5a;
  }
  else {
LAB_00125a5a:
    IVar7 = pnga_nnodes();
    pnga_error("Processors do not match for all arrays",IVar7);
  }
  lVar5 = pnga_is_mirrored(local_1a0);
  if (lVar5 == 0) {
    local_f0 = pnga_nnodes();
  }
  else {
    IVar7 = pnga_cluster_nodeid();
    local_f0 = pnga_cluster_nprocs(IVar7);
    IVar7 = pnga_cluster_procid(IVar7,0);
    IVar4 = IVar4 - IVar7;
  }
  pnga_inquire(local_1a0,&atype,&rank,dims);
  if (rank < 3) {
    if (rank == 1) {
      lVar10 = 1;
      local_1d0 = dims[0];
      if (local_190 < aihi) {
        local_1d0 = 1;
        lVar10 = dims[0];
      }
    }
    else {
      if (rank != 2) {
        pcVar11 = "rank must be atleast 1";
        goto LAB_00125b36;
      }
      local_1d0 = dims[1];
      lVar10 = dims[0];
    }
  }
  else {
    pcVar11 = "rank is greater than 2";
LAB_00125b36:
    pnga_error(pcVar11,rank);
    local_1d0 = 0;
    lVar10 = 0;
  }
  pnga_inquire(g_b,&btype,&rank,dims);
  local_dc = iVar3;
  if (rank < 3) {
    if (rank == 1) {
      lVar15 = 1;
      IVar7 = dims[0];
      if (bilo < bihi) {
        IVar7 = 1;
        lVar15 = dims[0];
      }
    }
    else {
      lVar15 = dims[0];
      IVar7 = dims[1];
      if (rank != 2) {
        pcVar11 = "rank must be atleast 1";
        goto LAB_00125bcb;
      }
    }
  }
  else {
    pcVar11 = "rank is greater than 2";
LAB_00125bcb:
    pnga_error(pcVar11,rank);
    lVar15 = 0;
    IVar7 = 0;
  }
  pnga_inquire(g_c,&ctype,&rank,dims);
  local_1a8 = IVar4;
  if (rank < 3) {
    if (rank == 1) {
      IVar4 = dims[0];
      lVar16 = 1;
      if (cilo < cihi) {
        IVar4 = 1;
        lVar16 = dims[0];
      }
    }
    else {
      IVar4 = dims[1];
      lVar16 = dims[0];
      if (rank != 2) {
        pcVar11 = "rank must be atleast 1";
        goto LAB_00125c58;
      }
    }
  }
  else {
    pcVar11 = "rank is greater than 2";
LAB_00125c58:
    pnga_error(pcVar11,rank);
    IVar4 = 0;
    lVar16 = 0;
  }
  if ((atype != btype) || (atype != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  if ((4 < atype - 0x3ebU) || (atype - 0x3ebU == 2)) {
    pnga_error(" type error",atype);
  }
  if ((*local_180 | 0x20) == 0x6e) {
    if ((local_190 < 1) || (local_1d0 < ajhi || (ajlo < 1 || lVar10 < aihi))) {
LAB_00125d27:
      pnga_error("  g_a indices out of range ",local_1a0);
    }
  }
  else if ((local_190 < 1) || (lVar10 < ajhi || (ajlo < 1 || local_1d0 < aihi))) goto LAB_00125d27;
  if ((*local_188 | 0x20) == 0x6e) {
    if ((bilo < 1) || (IVar7 < bjhi || (bjlo < 1 || lVar15 < bihi))) {
LAB_00125da6:
      pnga_error("  g_b indices out of range ",g_b);
    }
  }
  else if ((bilo < 1) || (lVar15 < bjhi || (bjlo < 1 || IVar7 < bihi))) goto LAB_00125da6;
  if ((((cilo < 1) || (cjlo < 1)) || (lVar16 < cihi)) || (IVar4 < cjhi)) {
    pnga_error("  g_c indices out of range ",g_c);
  }
  local_b0 = aihi - local_190;
  lVar10 = local_b0 + 1;
  lVar15 = bjhi - bjlo;
  if (cihi - cilo != local_b0) {
    pnga_error(" a & c dims error",lVar10);
  }
  lVar14 = ajhi - ajlo;
  lVar16 = lVar15 + 1;
  if (cjhi - cjlo != lVar15) {
    pnga_error(" b & c dims error",lVar16);
  }
  lVar13 = lVar14 + 1;
  local_108 = lVar15;
  local_f8 = lVar14;
  if (bihi - bilo != lVar14) {
    pnga_error(" a & b dims error",lVar13);
  }
  dVar19 = pow(((double)(lVar16 * lVar10) * (double)lVar13) / (double)(local_f0 * 10),
               0.3333333333333333);
  lVar14 = (long)dVar19;
  lVar15 = 0x20;
  if (0x20 < lVar14) {
    lVar15 = lVar14;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(&DWORD_001d54e8 + atype * 4);
  lVar8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) / auVar1,0);
  if (lVar14 < 0x101) {
    lVar15 = lVar8 * 4 + 0x30000;
    lVar10 = 0x100;
    lVar16 = 0x100;
    lVar14 = 0x100;
  }
  else {
    local_100 = lVar15;
    avail = pnga_memory_avail_type(atype);
    lVar5 = pnga_is_mirrored(local_1a0);
    fflush(_stdout);
    if (lVar5 == 0) {
      IVar4 = pnga_type_f2c(0x3f2);
      pnga_gop(IVar4,&avail,1,"min");
    }
    else {
      armci_msg_gop_scope(0x151,&avail,1,"min",-0x65);
      fflush(_stdout);
    }
    lVar14 = local_100;
    if ((avail < 0x40) && (IVar4 = pnga_nodeid(), IVar4 == 0)) {
      pnga_error("NotEnough memory",avail);
    }
    lVar15 = (long)((double)avail * 0.9);
    dVar19 = (double)((lVar15 + -4) / 3);
    if (dVar19 < 0.0) {
      dVar2 = sqrt(dVar19);
    }
    else {
      dVar2 = SQRT(dVar19);
    }
    if ((long)dVar2 < lVar14) {
      if (dVar19 < 0.0) {
        dVar19 = sqrt(dVar19);
      }
      else {
        dVar19 = SQRT(dVar19);
      }
      lVar14 = (long)dVar19;
    }
    if (lVar14 <= lVar10) {
      lVar10 = lVar14;
    }
    if (lVar14 <= lVar16) {
      lVar16 = lVar14;
    }
    if (lVar13 < lVar14) {
      lVar14 = lVar13;
    }
  }
  local_b8 = lVar10;
  local_198 = pnga_malloc(lVar15,(int)atype,"GA mulmat bufs");
  lVar13 = local_f8;
  lVar15 = local_108;
  if (atype == 0x3ec) {
    bVar17 = NAN(*beta);
    bVar18 = *beta == 0.0;
LAB_0012619d:
    if ((bVar18) && (!bVar17)) {
      bVar17 = true;
      goto LAB_001261a9;
    }
  }
  else {
    if (atype != 0x3ee) {
      if (atype == 0x3ef) {
        if ((*beta != 0.0) || (NAN(*beta))) goto LAB_001261a6;
        bVar17 = NAN(*(double *)((long)beta + 8));
        bVar18 = *(double *)((long)beta + 8) == 0.0;
      }
      else {
        bVar17 = NAN(*beta);
        bVar18 = *beta == 0.0;
      }
      goto LAB_0012619d;
    }
    if ((*beta == 0.0) && (!NAN(*beta))) {
      bVar17 = NAN(*(float *)((long)beta + 4));
      bVar18 = *(float *)((long)beta + 4) == 0.0;
      goto LAB_0012619d;
    }
  }
LAB_001261a6:
  bVar17 = false;
LAB_001261a9:
  local_100 = lVar14;
  pnga_mask_sync(0,0);
  avail = cilo;
  local_1c0 = cjlo;
  local_178 = cihi;
  local_170 = cjhi;
  if (bVar17) {
    pnga_fill_patch(g_c,&avail,&local_178,beta);
  }
  else {
    pnga_scale_patch(g_c,&avail,&local_178,beta);
  }
  if (-1 < lVar15) {
    lVar10 = ((lVar14 * lVar10) / lVar8) * 0x10;
    buf = (void *)((long)local_198 + lVar10 + 0x10);
    __s = (void *)((long)local_198 + ((lVar16 * lVar14) / lVar8) * 0x10 + lVar10 + 0x20);
    local_98 = 0;
    lVar8 = 0;
    local_60 = 0;
    lVar10 = local_b0;
    lVar14 = local_b8;
    IVar4 = local_1a8;
    local_68 = lVar16;
    do {
      lVar9 = local_60 + local_68;
      lVar16 = local_60 + -1 + local_68;
      if (lVar15 < lVar9) {
        lVar16 = lVar15;
      }
      jdim = (lVar16 - local_60) + 1;
      if (-1 < lVar13) {
        local_d0 = local_60 + bjlo;
        local_d8 = bjlo + lVar16;
        local_48 = local_60 + cjlo;
        local_50 = lVar16 + cjlo;
        local_58 = 0;
        local_60 = lVar9;
        do {
          lVar15 = local_58 + local_100;
          lVar16 = local_58 + -1 + local_100;
          if (lVar13 < lVar15) {
            lVar16 = lVar13;
          }
          kdim = (lVar16 - local_58) + 1;
          if (-1 < lVar10) {
            local_a0 = local_58 + ajlo;
            local_a8 = ajlo + lVar16;
            local_c0 = local_58 + bilo;
            local_c8 = lVar16 + bilo;
            lVar13 = 1;
            bVar17 = true;
            lVar16 = 0;
            local_58 = lVar15;
            do {
              lVar9 = lVar16 + lVar14;
              if (lVar8 % local_f0 == IVar4) {
                lVar15 = lVar14 + -1 + lVar16;
                if (lVar10 < lVar9) {
                  lVar15 = lVar10;
                }
                lVar10 = lVar15 + lVar13;
                lVar14 = jdim * lVar10;
                cdim = lVar10;
                idim = lVar10;
                if (atype == 0x3eb) {
                  if (0 < lVar14) {
                    __n = lVar14 * 4;
                    goto LAB_001263f7;
                  }
                }
                else if ((atype == 0x3ec) || (atype == 0x3ee)) {
                  if (0 < lVar14) {
                    __n = lVar14 * 8;
                    goto LAB_001263f7;
                  }
                }
                else if (0 < lVar14) {
                  __n = lVar14 * 0x10;
LAB_001263f7:
                  memset(__s,0,__n);
                }
                if ((*local_180 | 0x20) == 0x6e) {
                  pIVar12 = &idim;
                  avail = local_190 + lVar16;
                  local_1c0 = local_a0;
                  local_178 = lVar15 + local_190;
                  local_170 = local_a8;
                }
                else {
                  local_1c0 = local_190 + lVar16;
                  local_170 = lVar15 + local_190;
                  pIVar12 = &kdim;
                  avail = local_a0;
                  local_178 = local_a8;
                  lVar10 = kdim;
                }
                pnga_get(local_1a0,&avail,&local_178,local_198,pIVar12);
                if (bVar17) {
                  pIVar12 = &kdim;
                  avail = local_c0;
                  local_1c0 = local_d0;
                  local_178 = local_c8;
                  local_170 = local_d8;
                  if ((*local_188 | 0x20) != 0x6e) {
                    pIVar12 = &jdim;
                    avail = local_d0;
                    local_1c0 = local_c0;
                    local_178 = local_d8;
                    local_170 = local_c8;
                  }
                  local_98 = *pIVar12;
                  pnga_get(g_b,&avail,&local_178,buf,pIVar12);
                }
                idim_t = idim;
                jdim_t = jdim;
                kdim_t = kdim;
                bdim_t = local_98;
                cdim_t = cdim;
                adim_t = lVar10;
                switch(atype) {
                case 0x3eb:
                  gal_sgemm_(local_180,local_188,&idim_t,&jdim_t,&kdim_t,local_148,local_198,&adim_t
                             ,buf,&bdim_t,&local_150,__s,&cdim_t,1,1);
                  break;
                case 0x3ec:
                  gal_dgemm_(local_180,local_188,&idim_t,&jdim_t,&kdim_t,local_148,local_198,&adim_t
                             ,buf,&bdim_t,&local_78,__s,&cdim_t,1,1);
                  break;
                default:
                  pnga_error("ga_matmul_patch: wrong data type",atype);
                  break;
                case 0x3ee:
                  gal_cgemm_(local_180,local_188,&idim_t,&jdim_t,&kdim_t,local_148,local_198,&adim_t
                             ,buf,&bdim_t,&local_150,__s,&cdim_t,1,1);
                  break;
                case 0x3ef:
                  gal_zgemm_(local_180,local_188,&idim_t,&jdim_t,&kdim_t,local_148,local_198,&adim_t
                             ,buf,&bdim_t,&local_78,__s,&cdim_t,1,1);
                }
                IVar4 = local_1a8;
                alpha_00 = &local_150;
                if ((atype != 0x3eb) && (atype != 0x3ee)) {
                  alpha_00 = &local_78;
                }
                avail = lVar16 + cilo;
                local_178 = lVar15 + cilo;
                local_1c0 = local_48;
                local_170 = local_50;
                pnga_acc(g_c,&avail,&local_178,__s,&cdim,alpha_00);
                bVar17 = false;
                lVar10 = local_b0;
                lVar14 = local_b8;
              }
              lVar8 = lVar8 + 1;
              lVar13 = lVar13 - lVar14;
              lVar16 = lVar9;
              lVar15 = local_58;
            } while (lVar9 <= lVar10);
          }
          local_58 = lVar15;
          lVar13 = local_f8;
          lVar9 = local_60;
        } while (local_58 <= local_f8);
      }
      local_60 = lVar9;
      lVar15 = local_108;
    } while (local_60 <= local_108);
  }
  pnga_free(local_198);
  if (local_dc != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_matmul_mirrored(transa, transb, alpha, beta,
			g_a, ailo, aihi, ajlo, ajhi,
			g_b, bilo, bihi, bjlo, bjhi,
			g_c, cilo, cihi, cjlo, cjhi)

     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     Integer g_c, cilo, cihi, cjlo, cjhi;    /* patch of g_c */
     void    *alpha, *beta;
     char    *transa, *transb;
{

    #ifdef STATBUF
  /* approx. sqrt(2) ratio in chunk size to use the same buffer space */
   DoubleComplex a[ICHUNK*KCHUNK], b[KCHUNK*JCHUNK], c[ICHUNK*JCHUNK];
#else
   DoubleComplex *a, *b, *c;
#endif
Integer atype, btype, ctype, adim1=0, adim2=0, bdim1=0, bdim2=0, cdim1=0, cdim2=0, dims[2], rank;
Integer me= pnga_nodeid(), nproc;
Integer i, ijk = 0, i0, i1, j0, j1;
Integer ilo, ihi, idim, jlo, jhi, jdim, klo, khi, kdim;
Integer n, m, k, adim, bdim=0, cdim;
Integer Ichunk, Kchunk, Jchunk;
DoubleComplex ONE;
SingleComplex ONE_CF;

DoublePrecision chunk_cube;
Integer min_tasks = 10, max_chunk;
int need_scaling=1;
Integer ZERO_I = 0, inode, iproc;
Integer get_new_B;
int local_sync_begin,local_sync_end;
BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;
Integer clo[2], chi[2];

   ONE.real =1.; ONE.imag =0.;
   ONE_CF.real =1.; ONE_CF.imag =0.;

   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(local_sync_begin)pnga_sync();


   /* Check to make sure all global arrays are of the same type */
   if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
        pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
     pnga_error("Processors do not match for all arrays",pnga_nnodes());
   }
   if (pnga_is_mirrored(g_a)) {
     inode = pnga_cluster_nodeid();
     nproc = pnga_cluster_nprocs(inode);
     iproc = me - pnga_cluster_procid(inode, ZERO_I);
   } else {
     nproc = pnga_nnodes();
     iproc = me;
   }

   pnga_inquire(g_a, &atype, &rank, dims); 
   VECTORCHECK(rank, dims, adim1, adim2, ailo, aihi, ajlo, ajhi);
   pnga_inquire(g_b, &btype, &rank, dims); 
   VECTORCHECK(rank, dims, bdim1, bdim2, bilo, bihi, bjlo, bjhi);
   pnga_inquire(g_c, &ctype, &rank, dims); 
   VECTORCHECK(rank, dims, cdim1, cdim2, cilo, cihi, cjlo, cjhi);

   if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
   if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
     pnga_error(" type error",atype);
   
   
   
   /* check if patch indices and dims match */
   if (*transa == 'n' || *transa == 'N'){
     if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
       pnga_error("  g_a indices out of range ", g_a);
   }else
     if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
       pnga_error("  g_a indices out of range ", g_a);
   
   if (*transb == 'n' || *transb == 'N'){
     if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error("  g_b indices out of range ", g_b);
   }else
     if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
       pnga_error("  g_b indices out of range ", g_b);
   
   if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
     pnga_error("  g_c indices out of range ", g_c);
   
   /* verify if patch dimensions are consistent */
   m = aihi - ailo +1;
   n = bjhi - bjlo +1;
   k = ajhi - ajlo +1;
   if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
   if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
   if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);
   

   /* In 32-bit platforms, k*m*n might exceed the "long" range(2^31), 
      eg:k=m=n=1600. So casting the temporary value to "double" helps */
   chunk_cube = (k*(double)(m*n)) / (min_tasks * nproc);
   max_chunk = (Integer)pow(chunk_cube, (DoublePrecision)(1.0/3.0) );
   if (max_chunk < 32) max_chunk = 32;

#ifdef STATBUF
   if(atype ==  C_DBL || atype == C_FLOAT){
      Ichunk=D_CHUNK, Kchunk=D_CHUNK, Jchunk=D_CHUNK;
   }else{
      Ichunk=ICHUNK; Kchunk=KCHUNK; Jchunk=JCHUNK;
   }
#else
   {
     /**
      * Find out how much memory we can grab.  It will be used in
      * three chunks, and the result includes only the first one.
      */
     
     Integer elems, factor = sizeof(DoubleComplex)/GAsizeofM(atype);
     Ichunk = Jchunk = Kchunk = CHUNK_SIZE;
     
     if ( max_chunk > Ichunk) {       
       /*if memory if very limited, performance degrades for large matrices
	 as chunk size is very small, which leads to communication overhead)*/
       Integer avail = pnga_memory_avail_type(atype);
       if (pnga_is_mirrored(g_a)) {
         fflush(stdout);
         if (sizeof(Integer)/sizeof(int) > 1)
           armci_msg_gop_scope(SCOPE_NODE, &avail, 1, "min", ARMCI_LONG);
         else
           armci_msg_gop_scope(SCOPE_NODE, &avail, 1, "min", ARMCI_INT);
         fflush(stdout);
       } else {
         fflush(stdout);
         pnga_gop(pnga_type_f2c(MT_F_INT), &avail, (Integer)1, "min");
       }
       if(avail<MINMEM && pnga_nodeid()==0) pnga_error("NotEnough memory",avail);
       elems = (Integer)(avail*0.9); /* Donot use every last drop */
       
       max_chunk=GA_MIN(max_chunk, (Integer)(sqrt( (double)((elems-EXTRA)/3))));
       Ichunk = GA_MIN(m,max_chunk);
       Jchunk = GA_MIN(n,max_chunk);
       Kchunk = GA_MIN(k,max_chunk);
     }
     else /* "EXTRA" elems for safety - just in case */
       elems = 3*Ichunk*Jchunk + EXTRA*factor;
     
     a = (DoubleComplex*) pnga_malloc(elems, atype, "GA mulmat bufs");
     b = a + (Ichunk*Kchunk)/factor + 1; 
     c = b + (Kchunk*Jchunk)/factor + 1;
   }
#endif

   if(atype==C_DCPL){if((((DoubleComplex*)beta)->real == 0) &&
	       (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_SCPL){if((((SingleComplex*)beta)->real == 0) &&
	       (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_DBL){if(*(DoublePrecision *)beta == 0) need_scaling =0;}
   else if( *(float*)beta ==0) need_scaling =0;

   pnga_mask_sync(ZERO_I, ZERO_I);
   clo[0] = cilo; clo[1] = cjlo;
   chi[0] = cihi; chi[1] = cjhi;
   if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);
   else  pnga_fill_patch(g_c, clo, chi, beta);

   for(jlo = 0; jlo < n; jlo += Jchunk){ /* loop through columns of g_c patch */
       jhi = GA_MIN(n-1, jlo+Jchunk-1);
       jdim= jhi - jlo +1;

       for(klo = 0; klo < k; klo += Kchunk){    /* loop cols of g_a patch */
	 khi = GA_MIN(k-1, klo+Kchunk-1);          /* loop rows of g_b patch */
	 kdim= khi - klo +1;                                     
	 
	 /** Each pass through the outer two loops means we need a
	     different patch of B.*/
	 get_new_B = TRUE;
	 
	 for(ilo = 0; ilo < m; ilo += Ichunk){ /*loop through rows of g_c patch */
	   
	   if(ijk%nproc == iproc){

	     ihi = GA_MIN(m-1, ilo+Ichunk-1);
	     idim= cdim = ihi - ilo +1;
	     
	     if(atype == C_FLOAT) 
	       for (i = 0; i < idim*jdim; i++) *(((float*)c)+i)=0;
	     else if(atype ==  C_DBL)
	       for (i = 0; i < idim*jdim; i++) *(((double*)c)+i)=0;
	     else if(atype ==  C_SCPL)
	       for (i = 0; i < idim*jdim; i++){
                 ((SingleComplex*)c)[i].real=0;
                 ((SingleComplex*)c)[i].imag=0;
               }
	     else
	       for (i = 0; i < idim*jdim; i++){ c[i].real=0;c[i].imag=0;}
	     
	     if (*transa == 'n' || *transa == 'N'){ 
	       adim = idim;
	       i0= ailo+ilo; i1= ailo+ihi;   
	       j0= ajlo+klo; j1= ajlo+khi;
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_get(g_a, clo, chi, a, &idim);
	     }else{
	       adim = kdim;
	       i0= ajlo+klo; i1= ajlo+khi;   
	       j0= ailo+ilo; j1= ailo+ihi;
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_get(g_a, clo, chi, a, &kdim);
	     }


	     /* Avoid rereading B if it is the same patch as last time. */
        if(get_new_B) { 
          if (*transb == 'n' || *transb == 'N'){ 
            bdim = kdim;
            i0= bilo+klo; i1= bilo+khi;   
            j0= bjlo+jlo; j1= bjlo+jhi;
            clo[0] = i0;
            clo[1] = j0;
            chi[0] = i1;
            chi[1] = j1;
            pnga_get(g_b, clo, chi, b, &kdim);
          }else{
            bdim = jdim;
            i0= bjlo+jlo; i1= bjlo+jhi;   
            j0= bilo+klo; j1= bilo+khi;
            clo[0] = i0;
            clo[1] = j0;
            chi[0] = i1;
            chi[1] = j1;
            pnga_get(g_b, clo, chi, b, &jdim);
          }
          get_new_B = FALSE; /* Until J or K change again */
        }

	     
	     idim_t=idim; jdim_t=jdim; kdim_t=kdim;
	     adim_t=adim; bdim_t=bdim; cdim_t=cdim;

	     switch(atype) {
	     case C_FLOAT:
	       BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (Real *)alpha, (Real *)a, &adim_t,
              (Real *)b, &bdim_t, (Real *)&ONE_CF,
              (Real *)c, &cdim_t);
	       break;
	     case C_DBL:
	       BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (DoublePrecision *)alpha, (DoublePrecision *)a, &adim_t,
              (DoublePrecision *)b, &bdim_t, (DoublePrecision *)&ONE,
              (DoublePrecision *)c, &cdim_t);
	       break;
	     case C_DCPL:
	       BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (DoubleComplex *)alpha, (DoubleComplex *)a, &adim_t,
              (DoubleComplex *)b, &bdim_t, (DoubleComplex *)&ONE,
              (DoubleComplex *)c, &cdim_t);
	       break;
	     case C_SCPL:
	       BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (SingleComplex *)alpha, (SingleComplex *)a, &adim_t,
              (SingleComplex *)b, &bdim_t, (SingleComplex *)&ONE_CF,
              (SingleComplex *)c, &cdim_t);
	       break;
	     default:
	       pnga_error("ga_matmul_patch: wrong data type", atype);
	     }
	     
	     i0= cilo+ilo; i1= cilo+ihi;   j0= cjlo+jlo; j1= cjlo+jhi;
	     if(atype == C_FLOAT || atype == C_SCPL)  {
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_acc(g_c, clo, chi, (float *)c, &cdim, &ONE_CF);
        } else {
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_acc(g_c, clo, chi, (DoublePrecision*)c, &cdim, (DoublePrecision*)&ONE);
        }
	   }
	   ++ijk;
	 }
       }
   }
   
#ifndef STATBUF
   pnga_free(a);
#endif

   if(local_sync_end)pnga_sync();

}